

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

int duckdb_fmt::v6::internal::
    parse_nonnegative_int<char,duckdb_fmt::v6::internal::precision_adapter<duckdb_fmt::v6::internal::specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,duckdb_fmt::v6::internal::error_handler>,duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>&,char>&>
              (char **begin,char *end,
              precision_adapter<duckdb_fmt::v6::internal::specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_>_&,_char>
              *eh)

{
  specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_>
  *this;
  char *pcVar1;
  char cVar2;
  uint uVar3;
  string local_68;
  undefined1 *local_48;
  long local_40;
  undefined1 local_38 [16];
  
  pcVar1 = *begin;
  cVar2 = *pcVar1;
  if (cVar2 == '0') {
    *begin = pcVar1 + 1;
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    do {
      pcVar1 = pcVar1 + 1;
      if (0xccccccc < uVar3) {
        uVar3 = 0x80000000;
        goto LAB_0126dc8b;
      }
      uVar3 = ((int)cVar2 + uVar3 * 10) - 0x30;
      *begin = pcVar1;
    } while ((pcVar1 != end) && (cVar2 = *pcVar1, (byte)(cVar2 - 0x30U) < 10));
    if ((int)uVar3 < 0) {
LAB_0126dc8b:
      local_48 = local_38;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"number is too big","");
      this = eh->handler;
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_68,local_48,local_48 + local_40);
      specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
      ::on_error(&this->
                  super_specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                 ,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
      if (local_48 != local_38) {
        operator_delete(local_48);
      }
    }
  }
  return uVar3;
}

Assistant:

FMT_CONSTEXPR int parse_nonnegative_int(const Char*& begin, const Char* end,
                                        ErrorHandler&& eh) {
  FMT_ASSERT(begin != end && '0' <= *begin && *begin <= '9', "");
  if (*begin == '0') {
    ++begin;
    return 0;
  }
  unsigned value = 0;
  // Convert to unsigned to prevent a warning.
  constexpr unsigned max_int = max_value<int>();
  unsigned big = max_int / 10;
  do {
    // Check for overflow.
    if (value > big) {
      value = max_int + 1;
      break;
    }
    value = value * 10 + unsigned(*begin - '0');
    ++begin;
  } while (begin != end && '0' <= *begin && *begin <= '9');
  if (value > max_int) eh.on_error("number is too big");
  return static_cast<int>(value);
}